

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O1

void stealgold(monst *mtmp)

{
  short sVar1;
  boolean bVar2;
  uint uVar3;
  obj *obj;
  long lVar4;
  obj *obj_00;
  char *pcVar5;
  char *pcVar6;
  
  for (obj = gold_at(level,(int)u.ux,(int)u.uy);
      (obj_00 = invent, obj != (obj *)0x0 && (obj->otyp != 0x1ef)); obj = (obj->v).v_nexthere) {
  }
  for (; (obj_00 != (obj *)0x0 && (obj_00->otyp != 0x1ef)); obj_00 = obj_00->nobj) {
  }
  if ((obj != (obj *)0x0) &&
     (((obj_00 == (obj *)0x0 || (obj_00->quan < obj->quan)) ||
      (uVar3 = mt_random(), uVar3 * -0x33333333 < 0x33333334)))) {
    obj_extract_self(obj);
    add_to_minv(mtmp,obj);
    newsym((int)u.ux,(int)u.uy);
    pcVar5 = Monnam(mtmp);
    pcVar6 = body_part(5);
    pcVar6 = makeplural(pcVar6);
    pline("%s quickly snatches some gold from between your %s!",pcVar5,pcVar6);
    if ((obj_00 == (obj *)0x0) || (uVar3 = mt_random(), uVar3 * -0x33333333 < 0x33333334)) {
      bVar2 = tele_restrict(mtmp);
      if (bVar2 == '\0') {
        rloc(level,mtmp,'\0');
      }
      monflee(mtmp,0,'\0','\0');
      return;
    }
  }
  else if (obj_00 != (obj *)0x0) {
    sVar1 = objects[0x1ef].oc_cost;
    lVar4 = money_cnt(invent);
    lVar4 = somegold(lVar4);
    lVar4 = (lVar4 + sVar1 + -1) / (long)sVar1;
    if (lVar4 < obj_00->quan) {
      obj_00 = splitobj(obj_00,lVar4);
    }
    freeinv(obj_00);
    add_to_minv(mtmp,obj_00);
    pline("Your purse feels lighter.");
    bVar2 = tele_restrict(mtmp);
    if (bVar2 == '\0') {
      rloc(level,mtmp,'\0');
    }
    monflee(mtmp,0,'\0','\0');
    iflags.botl = '\x01';
  }
  return;
}

Assistant:

void stealgold(struct monst *mtmp)
{
	struct obj *fgold = gold_at(level, u.ux, u.uy);
	struct obj *ygold;
	long tmp;

        /* skip lesser coins on the floor */        
        while (fgold && fgold->otyp != GOLD_PIECE) fgold = fgold->nexthere; 

        /* Do you have real gold? */
        ygold = findgold(invent);

	if (fgold && ( !ygold || fgold->quan > ygold->quan || !rn2(5))) {
            obj_extract_self(fgold);
	    add_to_minv(mtmp, fgold);
	    newsym(u.ux, u.uy);
	    pline("%s quickly snatches some gold from between your %s!",
		    Monnam(mtmp), makeplural(body_part(FOOT)));
	    if (!ygold || !rn2(5)) {
		if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
		monflee(mtmp, 0, FALSE, FALSE);
	    }
	} else if (ygold) {
            const int gold_price = objects[GOLD_PIECE].oc_cost;
	    tmp = (somegold(money_cnt(invent)) + gold_price - 1) / gold_price;
	    tmp = min(tmp, ygold->quan);
            if (tmp < ygold->quan) ygold = splitobj(ygold, tmp);
            freeinv(ygold);
            add_to_minv(mtmp, ygold);
	    pline("Your purse feels lighter.");
	    if (!tele_restrict(mtmp)) rloc(level, mtmp, FALSE);
	    monflee(mtmp, 0, FALSE, FALSE);
	    iflags.botl = 1;
	}
}